

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_4::draw
               (Functions *gl,EGLint api,Program *program,DrawPrimitiveOp *drawOp)

{
  NotSupportedError *this;
  string local_40;
  
  if ((api != 4) && (api != 0x40)) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Unsupported API","");
    tcu::NotSupportedError::NotSupportedError(this,&local_40);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  drawGLES2(gl,program,drawOp);
  return;
}

Assistant:

void draw (const glw::Functions& gl, EGLint api, const Program& program, const DrawPrimitiveOp& drawOp)
{
	switch (api)
	{
		case EGL_OPENGL_ES2_BIT:		drawGLES2(gl, program, drawOp);		break;
		case EGL_OPENGL_ES3_BIT_KHR:	drawGLES2(gl, program, drawOp);		break;
		default:
			throw tcu::NotSupportedError("Unsupported API");
	}
}